

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

int TabItemComparerBySection(void *lhs,void *rhs)

{
  int iVar1;
  int iVar2;
  int b_section;
  int a_section;
  ImGuiTabItem *b;
  ImGuiTabItem *a;
  void *rhs_local;
  void *lhs_local;
  
  iVar1 = TabItemGetSectionIdx((ImGuiTabItem *)lhs);
  iVar2 = TabItemGetSectionIdx((ImGuiTabItem *)rhs);
  if (iVar1 == iVar2) {
    lhs_local._4_4_ = (int)*(short *)((long)lhs + 0x2a) - (int)*(short *)((long)rhs + 0x2a);
  }
  else {
    lhs_local._4_4_ = iVar1 - iVar2;
  }
  return lhs_local._4_4_;
}

Assistant:

static int IMGUI_CDECL TabItemComparerBySection(const void* lhs, const void* rhs)
{
    const ImGuiTabItem* a = (const ImGuiTabItem*)lhs;
    const ImGuiTabItem* b = (const ImGuiTabItem*)rhs;
    const int a_section = TabItemGetSectionIdx(a);
    const int b_section = TabItemGetSectionIdx(b);
    if (a_section != b_section)
        return a_section - b_section;
    return (int)(a->IndexDuringLayout - b->IndexDuringLayout);
}